

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_striped_avx2_256_8
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  parasail_profile_t *profile_00;
  undefined4 in_stack_00000014;
  int in_stack_0000001c;
  undefined4 in_stack_00000024;
  int in_stack_000002e0;
  int in_stack_000002e4;
  int in_stack_000002e8;
  int in_stack_000002ec;
  char *in_stack_000002f0;
  parasail_profile_t *in_stack_000002f8;
  int in_stack_ffffffffffffffb0;
  parasail_result_t *result;
  parasail_profile_t *profile;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_avx2_256_8","s2");
    s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_avx2_256_8","s2Len");
    s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_avx2_256_8","open");
    s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_avx2_256_8","gap");
    s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_avx2_256_8","matrix");
    s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_avx2_256_8","s1");
        return (parasail_result_t *)0x0;
      }
      if (s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_avx2_256_8","s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    profile_00 = parasail_profile_create_avx_256_8
                           ((char *)CONCAT44(in_stack_00000024,s2_beg),in_stack_0000001c,
                            (parasail_matrix_t *)CONCAT44(in_stack_00000014,s1_beg));
    if (profile_00 == (parasail_profile_t *)0x0) {
      s1_local = (char *)0x0;
    }
    else {
      s1_local = (char *)parasail_sg_flags_table_striped_profile_avx2_256_8
                                   (in_stack_000002f8,in_stack_000002f0,in_stack_000002ec,
                                    in_stack_000002e8,in_stack_000002e4,in_stack_000002e0,s2_beg,
                                    s2_end,in_stack_ffffffffffffffb0);
      parasail_profile_free(profile_00);
    }
  }
  return (parasail_result_t *)s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_profile_t *profile = NULL;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
        PARASAIL_CHECK_GT0(s1Len);
    }

    /* initialize local variables */
    profile = parasail_profile_create_avx_256_8(s1, s1Len, matrix);
    if (!profile) return NULL;
    result = PNAME(profile, s2, s2Len, open, gap, s1_beg, s1_end, s2_beg, s2_end);

    parasail_profile_free(profile);

    return result;
}